

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  bool bVar2;
  void *pvVar3;
  ostream *poVar4;
  vector<int,_std::allocator<int>_> *__range1;
  int *x;
  int *piVar5;
  vector<int,_std::allocator<int>_> r;
  int k;
  priority_queue<int,_std::less<int>_> pq;
  vector<int,_std::allocator<int>_> local_68;
  int local_4c;
  priority_queue<int,_std::less<int>_> local_48;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105198) = 0;
  local_48.mData = (int *)operator_new__(4);
  *local_48.mData = 0;
  local_48.mCap = 1;
  local_48.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&local_4c);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  do {
    CP::priority_queue<int,_std::less<int>_>::push(&local_48,(int *)&local_68);
    iVar1 = (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    bVar2 = (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < 9;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = iVar1;
  } while (bVar2);
  CP::priority_queue<int,_std::less<int>_>::at_level(&local_68,&local_48,(long)local_4c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size = ",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  for (piVar5 = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
      piVar5 != local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pvVar3 = (void *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (local_48.mData != (int *)0x0) {
    operator_delete__(local_48.mData);
  }
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false); cin.tie(NULL);

  CP::priority_queue<int> pq;

  int n,k;
  n = 10;
  cin >> k;
//  cin >> n >> k;
//  while(n--) {
//    int x;
//    cin >> x;
//    pq.push(x);
//  }
  for (int i = 0; i < 10; ++i) {
      pq.push(i);
  }

  std::vector<int> r = pq.at_level(k);
  cout << "size = " << r.size() << endl;
  for (auto &x : r) {
    cout << x << " ";
  }
  cout << endl;

}